

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

double sqlite3VdbeRealValue(Mem *pMem)

{
  Mem *pMem_local;
  
  if ((pMem->flags & 8) == 0) {
    if ((pMem->flags & 0x24) == 0) {
      if ((pMem->flags & 0x12) == 0) {
        pMem_local = (Mem *)0x0;
      }
      else {
        pMem_local = (Mem *)memRealValue(pMem);
      }
    }
    else {
      pMem_local = (Mem *)(double)(pMem->u).i;
    }
  }
  else {
    pMem_local = (Mem *)(pMem->u).pDef;
  }
  return (double)pMem_local;
}

Assistant:

SQLITE_PRIVATE double sqlite3VdbeRealValue(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  if( pMem->flags & MEM_Real ){
    return pMem->u.r;
  }else if( pMem->flags & (MEM_Int|MEM_IntReal) ){
    testcase( pMem->flags & MEM_IntReal );
    return (double)pMem->u.i;
  }else if( pMem->flags & (MEM_Str|MEM_Blob) ){
    return memRealValue(pMem);
  }else{
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return (double)0;
  }
}